

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O0

bool __thiscall
BamTools::Internal::BamReaderPrivate::CreateIndex(BamReaderPrivate *this,IndexType *type)

{
  bool bVar1;
  string message;
  string bracError;
  IndexType *in_stack_000001d8;
  BamReaderPrivate *in_stack_000001e0;
  BamRandomAccessController *in_stack_000001e8;
  BamRandomAccessController *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  allocator *paVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator local_101;
  string local_100 [39];
  allocator<char> local_d9;
  string local_d8 [8];
  string *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  BamReaderPrivate *in_stack_ffffffffffffff40;
  string local_b8 [32];
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [55];
  byte local_1;
  
  bVar1 = IsOpen((BamReaderPrivate *)0x1ae2b9);
  if (bVar1) {
    bVar1 = BamRandomAccessController::CreateIndex
                      (in_stack_000001e8,in_stack_000001e0,in_stack_000001d8);
    if (bVar1) {
      local_1 = 1;
    }
    else {
      BamRandomAccessController::GetErrorString_abi_cxx11_(in_stack_fffffffffffffec8);
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d8,"could not create index: \n\t",(allocator *)__lhs);
      std::operator+(__lhs,in_stack_fffffffffffffed0);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator(&local_d9);
      paVar2 = &local_101;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_100,"BamReader::CreateIndex",paVar2);
      SetErrorString(in_stack_ffffffffffffff40,(string *)in_stack_ffffffffffffff38,
                     in_stack_ffffffffffffff30);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      local_1 = 0;
      std::__cxx11::string::~string(local_b8);
      std::__cxx11::string::~string(local_98);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"BamReader::CreateIndex",&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"cannot create index on unopened BAM file",&local_71);
    SetErrorString(in_stack_ffffffffffffff40,(string *)in_stack_ffffffffffffff38,
                   in_stack_ffffffffffffff30);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool BamReaderPrivate::CreateIndex(const BamIndex::IndexType& type) {

    // skip if BAM file not open
    if ( !IsOpen() ) {
        SetErrorString("BamReader::CreateIndex", "cannot create index on unopened BAM file");
        return false;
    }

    // attempt to create index
    if ( m_randomAccessController.CreateIndex(this, type) )
        return true;
    else {
        const string bracError = m_randomAccessController.GetErrorString();
        const string message = string("could not create index: \n\t") + bracError;
        SetErrorString("BamReader::CreateIndex", message);
        return false;
    }
}